

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

Float __thiscall pbrt::Curve::Area(Curve *this)

{
  long *in_RDI;
  Float FVar1;
  Float FVar2;
  type tVar3;
  int i;
  Float approxLength;
  Float avgWidth;
  Float width1;
  Float width0;
  array<pbrt::Point3<float>,_4> cpObj;
  int local_5c;
  float fVar4;
  float fVar5;
  array<pbrt::Point3<float>,_4> local_38;
  
  pstd::MakeConstSpan<pbrt::Point3<float>,_4UL>((Point3<float> (*) [4])0x45f7bf);
  CubicBezierControlPoints<pbrt::Point3<float>>
            ((span<const_pbrt::Point3<float>_>)cpObj.values._24_16_,
             cpObj.values[1].super_Tuple3<pbrt::Point3,_float>.z,
             cpObj.values[1].super_Tuple3<pbrt::Point3,_float>.y);
  FVar1 = Lerp(*(Float *)(in_RDI + 1),*(Float *)(*in_RDI + 0x34),*(Float *)(*in_RDI + 0x38));
  FVar2 = Lerp(*(Float *)((long)in_RDI + 0xc),*(Float *)(*in_RDI + 0x34),*(Float *)(*in_RDI + 0x38))
  ;
  fVar5 = (FVar1 + FVar2) * 0.5;
  fVar4 = 0.0;
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    pstd::array<pbrt::Point3<float>,_4>::operator[](&local_38,(long)local_5c);
    pstd::array<pbrt::Point3<float>,_4>::operator[](&local_38,(long)(local_5c + 1));
    tVar3 = Distance<float>((Point3<float> *)CONCAT44(FVar1,FVar2),
                            (Point3<float> *)CONCAT44(fVar5,fVar4));
    fVar4 = tVar3 + fVar4;
  }
  return fVar4 * fVar5;
}

Assistant:

Float Curve::Area() const {
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::MakeConstSpan(common->cpObj), uMin, uMax);
    Float width0 = Lerp(uMin, common->width[0], common->width[1]);
    Float width1 = Lerp(uMax, common->width[0], common->width[1]);
    Float avgWidth = (width0 + width1) * 0.5f;
    Float approxLength = 0.f;
    for (int i = 0; i < 3; ++i)
        approxLength += Distance(cpObj[i], cpObj[i + 1]);
    return approxLength * avgWidth;
}